

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O2

void Centaurus::Stage3Runner::append_value<unsigned_long_const*>
               (unsigned_long **values_next_it,int n,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  StackEntryTag SVar1;
  pointer pSVar2;
  pointer puVar3;
  StackEntryTag local_14;
  
  pSVar2 = (tags->
           super__Vector_base<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  SVar1 = pSVar2[-1];
  if (SVar1 < VALUE) {
    std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    ::emplace_back<Centaurus::detail::StackEntryTag>(tags,&local_14);
  }
  else {
    pSVar2[-1] = SVar1 + n;
  }
  puVar3 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar3 = *puVar3 + (long)n;
  return;
}

Assistant:

static void append_value(Iterator& values_next_it, int n, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    if (detail::isValueTag(tags.back())) {
      tags.back() = static_cast<detail::StackEntryTag>(static_cast<int>(tags.back()) + n);
    } else {
      tags.emplace_back(static_cast<detail::StackEntryTag>(n));
    }
#if PYCENTAURUS
    values.front() += n;
#else
    for (int i = 0; i < n; i++) {
      values.emplace_back(*values_next_it++);
    }
#endif
  }